

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

char * nk_str_at_rune(nk_str *str,int pos,nk_rune *unicode,int *len)

{
  char *c;
  int clen;
  int text_len;
  char *text;
  int local_38;
  int glyph_len;
  int src_len;
  int i;
  int *len_local;
  nk_rune *unicode_local;
  int pos_local;
  nk_str *str_local;
  
  glyph_len = 0;
  local_38 = 0;
  if (str == (nk_str *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x2148,"char *nk_str_at_rune(struct nk_str *, int, nk_rune *, int *)");
  }
  if (unicode == (nk_rune *)0x0) {
    __assert_fail("unicode",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x2149,"char *nk_str_at_rune(struct nk_str *, int, nk_rune *, int *)");
  }
  if (len == (int *)0x0) {
    __assert_fail("len",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x214a,"char *nk_str_at_rune(struct nk_str *, int, nk_rune *, int *)");
  }
  if (((str == (nk_str *)0x0) || (unicode == (nk_rune *)0x0)) || (len == (int *)0x0)) {
    str_local = (nk_str *)0x0;
  }
  else if (pos < 0) {
    *unicode = 0;
    *len = 0;
    str_local = (nk_str *)0x0;
  }
  else {
    c = (char *)(str->buffer).memory.ptr;
    clen = (int)(str->buffer).allocated;
    text._4_4_ = nk_utf_decode(c,unicode,clen);
    while (text._4_4_ != 0) {
      if (glyph_len == pos) {
        *len = text._4_4_;
        break;
      }
      glyph_len = glyph_len + 1;
      local_38 = local_38 + text._4_4_;
      text._4_4_ = nk_utf_decode(c + local_38,unicode,clen - local_38);
    }
    if (glyph_len == pos) {
      str_local = (nk_str *)(c + local_38);
    }
    else {
      str_local = (nk_str *)0x0;
    }
  }
  return (char *)str_local;
}

Assistant:

NK_API char*
nk_str_at_rune(struct nk_str *str, int pos, nk_rune *unicode, int *len)
{
    int i = 0;
    int src_len = 0;
    int glyph_len = 0;
    char *text;
    int text_len;

    NK_ASSERT(str);
    NK_ASSERT(unicode);
    NK_ASSERT(len);

    if (!str || !unicode || !len) return 0;
    if (pos < 0) {
        *unicode = 0;
        *len = 0;
        return 0;
    }

    text = (char*)str->buffer.memory.ptr;
    text_len = (int)str->buffer.allocated;
    glyph_len = nk_utf_decode(text, unicode, text_len);
    while (glyph_len) {
        if (i == pos) {
            *len = glyph_len;
            break;
        }

        i++;
        src_len = src_len + glyph_len;
        glyph_len = nk_utf_decode(text + src_len, unicode, text_len - src_len);
    }
    if (i != pos) return 0;
    return text + src_len;
}